

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O2

void __thiscall
sjtu::map<long,_sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode_*,_std::less<long>_>
::erase_fixup(map<long,_sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode_*,_std::less<long>_>
              *this,Node *x)

{
  color_type cVar1;
  Node *pNVar2;
  Node *x_00;
  Node *pNVar3;
  
LAB_00111d85:
  do {
    while( true ) {
      pNVar2 = x->parent;
      if ((pNVar2 == this->nil) || (x->color != BLACK)) {
        x->color = BLACK;
        return;
      }
      x_00 = pNVar2->left;
      if (x_00 != x) break;
      x_00 = pNVar2->right;
      if (x_00->color == RED) {
        left_rotate(this,x_00);
        pNVar2 = x_00->left;
        goto LAB_00111dd8;
      }
      cVar1 = x_00->right->color;
      pNVar3 = x_00;
      if (x_00->left->color == BLACK) {
        if (cVar1 == BLACK) goto LAB_00111e52;
      }
      else if (cVar1 == BLACK) {
        right_rotate(this,x_00->left);
        pNVar3 = x_00->parent;
        cVar1 = x_00->color;
        x_00->color = pNVar3->color;
        pNVar3->color = cVar1;
      }
      left_rotate(this,pNVar3);
      cVar1 = pNVar3->color;
      pNVar3->color = pNVar3->left->color;
      pNVar3->left->color = cVar1;
      pNVar2 = pNVar3->right;
LAB_00111ea2:
      pNVar2->color = BLACK;
      x = this->nil->left;
    }
    if (x_00->color == RED) {
      right_rotate(this,x_00);
      pNVar2 = x_00->right;
LAB_00111dd8:
      cVar1 = x_00->color;
      x_00->color = pNVar2->color;
      pNVar2->color = cVar1;
      goto LAB_00111d85;
    }
    pNVar3 = x_00;
    if (x_00->left->color != BLACK) {
LAB_00111e19:
      right_rotate(this,pNVar3);
      cVar1 = pNVar3->color;
      pNVar3->color = pNVar3->right->color;
      pNVar3->right->color = cVar1;
      pNVar2 = pNVar3->left;
      goto LAB_00111ea2;
    }
    if (x_00->right->color != BLACK) {
      left_rotate(this,x_00->right);
      pNVar3 = x_00->parent;
      cVar1 = x_00->color;
      x_00->color = pNVar3->color;
      pNVar3->color = cVar1;
      goto LAB_00111e19;
    }
LAB_00111e52:
    x_00->color = RED;
    x = pNVar2;
  } while( true );
}

Assistant:

void erase_fixup(Node *x)
	{
		for (Node *y;x -> parent != nil && x -> color == BLACK;)
			if (x -> parent -> left == x)
			{
				y = x -> parent -> right;
				if (y -> color == RED) left_rotate(y) , std::swap(y -> color , y -> left -> color);
				else if (y -> left -> color == BLACK && y -> right -> color == BLACK) y -> color = RED , x = x -> parent;
				else
				{
					if (y -> right -> color == BLACK)
					{
						right_rotate(y -> left) , std::swap(y -> color , y -> parent -> color);
						y = y -> parent;
					}
					left_rotate(y) , std::swap(y -> color , y -> left -> color) , y -> right -> color = BLACK;
					x = nil -> left;
				}
			}
			else
			{
				y = x -> parent -> left;
				if (y -> color == RED) right_rotate(y) , std::swap(y -> color , y -> right -> color);
				else if (y -> left -> color == BLACK && y -> right -> color == BLACK) y -> color = RED , x = x -> parent;
				else
				{
					if (y -> left -> color == BLACK)
					{
						left_rotate(y -> right) , std::swap(y -> color , y -> parent -> color);
						y = y -> parent;
					}
					right_rotate(y) , std::swap(y -> color , y -> right -> color) , y -> left -> color = BLACK;
					x = nil -> left;
				}
			}
		x -> color = BLACK;
	}